

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O0

void __thiscall BufferPool_FreeBuffers_Test::TestBody(BufferPool_FreeBuffers_Test *this)

{
  void *__ptr;
  ulong local_60;
  size_t i;
  ulong local_48;
  size_t j;
  BufferPool pool;
  BufferPool_FreeBuffers_Test *this_local;
  
  pool._blocks._block._previous = (Block *)this;
  memt::BufferPool::BufferPool((BufferPool *)&j,5);
  for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
    memt::BufferPool::freeAllBuffers((BufferPool *)&j);
    for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
      __ptr = memt::BufferPool::alloc((BufferPool *)&j);
      memt::BufferPool::free((BufferPool *)&j,__ptr);
      memt::BufferPool::alloc((BufferPool *)&j);
    }
    memt::BufferPool::freeAllBuffers((BufferPool *)&j);
  }
  memt::BufferPool::~BufferPool((BufferPool *)&j);
  return;
}

Assistant:

TEST(BufferPool, FreeBuffers) {
  memt::BufferPool pool(5);
  for (size_t j = 0; j < 2; ++j) {
    pool.freeAllBuffers();
    for (size_t i = 0; i < 100; ++i) {
      pool.free(pool.alloc());
      pool.alloc();
    }
    pool.freeAllBuffers();
  }
}